

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

void * worker_start(void *thr_ptr)

{
  bool bVar1;
  uint mythread_j_389;
  uint mythread_i_389;
  uint mythread_j_382;
  uint mythread_i_382;
  uint mythread_j_353;
  uint mythread_i_353;
  worker_state state;
  worker_thread *thr;
  void *thr_ptr_local;
  
  mythread_j_353 = 0;
  while( true ) {
    bVar1 = false;
    while (!bVar1) {
      mythread_mutex_lock((mythread_mutex *)((long)thr_ptr + 0x160));
      bVar1 = false;
      while (!bVar1) {
        while( true ) {
          if (*thr_ptr == 3) {
            *(undefined4 *)thr_ptr = 0;
            mythread_cond_signal((mythread_cond *)((long)thr_ptr + 0x188));
          }
          mythread_j_353 = *thr_ptr;
          if (mythread_j_353 != 0) break;
          mythread_cond_wait((mythread_cond *)((long)thr_ptr + 0x188),
                             (mythread_mutex *)((long)thr_ptr + 0x160));
        }
        bVar1 = true;
      }
      bVar1 = true;
    }
    mythread_mutex_unlock((mythread_mutex *)((long)thr_ptr + 0x160));
    if (mythread_j_353 == 0) {
      __assert_fail("state != THR_IDLE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                    ,0x172,"void *worker_start(void *)");
    }
    if (mythread_j_353 == 3) {
      __assert_fail("state != THR_STOP",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                    ,0x173,"void *worker_start(void *)");
    }
    if (mythread_j_353 < 3) {
      mythread_j_353 = worker_encode((worker_thread *)thr_ptr,mythread_j_353);
    }
    if (mythread_j_353 == 4) break;
    bVar1 = false;
    while (!bVar1) {
      mythread_mutex_lock((mythread_mutex *)((long)thr_ptr + 0x160));
      bVar1 = false;
      while (!bVar1) {
        if (*thr_ptr != 4) {
          *(undefined4 *)thr_ptr = 0;
          mythread_cond_signal((mythread_cond *)((long)thr_ptr + 0x188));
        }
        bVar1 = true;
      }
      bVar1 = true;
    }
    mythread_mutex_unlock((mythread_mutex *)((long)thr_ptr + 0x160));
    bVar1 = false;
    while (!bVar1) {
      mythread_mutex_lock((mythread_mutex *)(*(long *)((long)thr_ptr + 0x20) + 0x168));
      bVar1 = false;
      while (!bVar1) {
        *(bool *)(*(long *)((long)thr_ptr + 0x18) + 0x20) = mythread_j_353 == 2;
        *(long *)(*(long *)((long)thr_ptr + 0x20) + 0x158) =
             *(long *)(*(long *)((long)thr_ptr + 0x18) + 0x18) +
             *(long *)(*(long *)((long)thr_ptr + 0x20) + 0x158);
        *(long *)(*(long *)((long)thr_ptr + 0x20) + 0x160) =
             *(long *)(*(long *)((long)thr_ptr + 0x18) + 8) +
             *(long *)(*(long *)((long)thr_ptr + 0x20) + 0x160);
        *(undefined8 *)((long)thr_ptr + 0x30) = 0;
        *(undefined8 *)((long)thr_ptr + 0x38) = 0;
        *(undefined8 *)((long)thr_ptr + 0x158) =
             *(undefined8 *)(*(long *)((long)thr_ptr + 0x20) + 0x148);
        *(void **)(*(long *)((long)thr_ptr + 0x20) + 0x148) = thr_ptr;
        mythread_cond_signal((mythread_cond *)(*(long *)((long)thr_ptr + 0x20) + 400));
        bVar1 = true;
      }
      bVar1 = true;
    }
    mythread_mutex_unlock((mythread_mutex *)(*(long *)((long)thr_ptr + 0x20) + 0x168));
  }
  mythread_mutex_destroy((mythread_mutex *)((long)thr_ptr + 0x160));
  mythread_cond_destroy((mythread_cond *)((long)thr_ptr + 0x188));
  lzma_next_end((lzma_next_coder *)((long)thr_ptr + 0x40),*(lzma_allocator **)((long)thr_ptr + 0x28)
               );
  lzma_free(*(void **)((long)thr_ptr + 8),*(lzma_allocator **)((long)thr_ptr + 0x28));
  return (void *)0x0;
}

Assistant:

static MYTHREAD_RET_TYPE
worker_start(void *thr_ptr)
{
	worker_thread *thr = thr_ptr;
	worker_state state = THR_IDLE; // Init to silence a warning

	while (true) {
		// Wait for work.
		mythread_sync(thr->mutex) {
			while (true) {
				// The thread is already idle so if we are
				// requested to stop, just set the state.
				if (thr->state == THR_STOP) {
					thr->state = THR_IDLE;
					mythread_cond_signal(&thr->cond);
				}

				state = thr->state;
				if (state != THR_IDLE)
					break;

				mythread_cond_wait(&thr->cond, &thr->mutex);
			}
		}

		assert(state != THR_IDLE);
		assert(state != THR_STOP);

		if (state <= THR_FINISH)
			state = worker_encode(thr, state);

		if (state == THR_EXIT)
			break;

		// Mark the thread as idle unless the main thread has
		// told us to exit. Signal is needed for the case
		// where the main thread is waiting for the threads to stop.
		mythread_sync(thr->mutex) {
			if (thr->state != THR_EXIT) {
				thr->state = THR_IDLE;
				mythread_cond_signal(&thr->cond);
			}
		}

		mythread_sync(thr->coder->mutex) {
			// Mark the output buffer as finished if
			// no errors occurred.
			thr->outbuf->finished = state == THR_FINISH;

			// Update the main progress info.
			thr->coder->progress_in
					+= thr->outbuf->uncompressed_size;
			thr->coder->progress_out += thr->outbuf->size;
			thr->progress_in = 0;
			thr->progress_out = 0;

			// Return this thread to the stack of free threads.
			thr->next = thr->coder->threads_free;
			thr->coder->threads_free = thr;

			mythread_cond_signal(&thr->coder->cond);
		}
	}

	// Exiting, free the resources.
	mythread_mutex_destroy(&thr->mutex);
	mythread_cond_destroy(&thr->cond);

	lzma_next_end(&thr->block_encoder, thr->allocator);
	lzma_free(thr->in, thr->allocator);
	return MYTHREAD_RET_VALUE;
}